

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::GroupNode::resetInDegree(GroupNode *this)

{
  bool bVar1;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_RDI;
  Ref<embree::SceneGraph::Node> *c;
  iterator __end2;
  iterator __begin2;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range2;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_20;
  pointer *local_18;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_8;
  
  *(undefined1 *)
   &in_RDI[3].
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  if (in_RDI[3].
      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x1) {
    local_18 = &in_RDI[4].
                super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_20._M_current =
         (Ref<embree::SceneGraph::Node> *)
         std::
         vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
         ::begin(in_RDI);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::end(in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffd0,
                              (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)in_RDI), bVar1) {
      in_stack_ffffffffffffffd0 =
           (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
            *)__gnu_cxx::
              __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
              ::operator*(&local_20);
      local_8 = in_stack_ffffffffffffffd0;
      (*(((Node *)in_stack_ffffffffffffffd0->_M_current)->super_RefCount)._vptr_RefCount[8])();
      __gnu_cxx::
      __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
      ::operator++(&local_20);
    }
  }
  in_RDI[3].
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)&in_RDI[3].
                        super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].ptr + 7);
  return;
}

Assistant:

void SceneGraph::GroupNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1) {
      for (auto&  c : children)
        c->resetInDegree();
    }
    indegree--;
  }